

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

ssize_t __thiscall r_code::SysObject::read(SysObject *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  SysView *this_00;
  uint32_t *puVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  uint32_t *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  Atom local_44;
  uint32_t *local_40;
  ulong local_38;
  
  puVar6 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  this->oid = *puVar6;
  uVar5 = (ulong)puVar6[1];
  uVar3 = (ulong)puVar6[2];
  local_38 = (ulong)puVar6[3];
  uVar8 = (ulong)puVar6[4];
  local_40 = puVar6;
  for (uVar9 = 0; puVar4 = local_40, uVar5 != uVar9; uVar9 = uVar9 + 1) {
    Atom::Atom(&local_44,puVar6[uVar9 + 5]);
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::push_back
              (&(this->super_ImageObject).code.m_vector,&local_44);
    Atom::~Atom(&local_44);
  }
  for (uVar9 = 0; puVar1 = local_40, uVar3 != uVar9; uVar9 = uVar9 + 1) {
    vector<unsigned_int>::push_back(&(this->super_ImageObject).references,puVar4[uVar5 + uVar9 + 5])
    ;
  }
  for (uVar9 = 0; uVar2 = local_38, local_38 != uVar9; uVar9 = uVar9 + 1) {
    vector<unsigned_int>::push_back(&this->markers,puVar1[uVar5 + uVar3 + uVar9 + 5]);
  }
  lVar7 = 0;
  puVar4 = puVar6 + uVar5 + uVar3 + 5;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    this_00 = (SysView *)operator_new(0x38);
    SysView::SysView(this_00);
    (*(this_00->super_ImageObject)._vptr_ImageObject[3])
              (this_00,puVar6 + uVar5 + uVar3 + 5 + uVar2 + lVar7);
    vector<r_code::SysView_*>::push_back(&this->views,this_00);
    puVar4 = (uint32_t *)SysView::get_size(this_00);
    lVar7 = lVar7 + (long)puVar4;
  }
  return (ssize_t)puVar4;
}

Assistant:

void SysObject::read(uint32_t *data)
{
    oid = data[0];
    size_t code_size = data[1];
    size_t reference_set_size = data[2];
    size_t marker_set_size = data[3];
    size_t view_set_size = data[4];
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[5 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[5 + i + j]);
    }

    for (k = 0; k < marker_set_size; ++k) {
        markers.push_back(data[5 + i + j + k]);
    }

    size_t offset = 0;

    for (l = 0; l < view_set_size; ++l) {
        SysView *v = new SysView();
        v->read(data + 5 + i + j + k + offset);
        views.push_back(v);
        offset += v->get_size();
    }
}